

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O1

bool __thiscall xray_re::xr_memory_writer::save_to(xr_memory_writer *this,char *path)

{
  pointer puVar1;
  int iVar2;
  xr_writer *pxVar3;
  
  if (xr_file_system::instance()::instance0 == '\0') {
    iVar2 = __cxa_guard_acquire(&xr_file_system::instance()::instance0);
    if (iVar2 != 0) {
      xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
      __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,
                   &__dso_handle);
      __cxa_guard_release(&xr_file_system::instance()::instance0);
    }
  }
  pxVar3 = xr_file_system::w_open(&xr_file_system::instance::instance0,path,false);
  if (pxVar3 != (xr_writer *)0x0) {
    puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*pxVar3->_vptr_xr_writer[2])
              (pxVar3,puVar1,
               (long)(this->m_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
    (*pxVar3->_vptr_xr_writer[1])(pxVar3);
  }
  return pxVar3 != (xr_writer *)0x0;
}

Assistant:

bool xr_memory_writer::save_to(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path);
	if (w == 0)
		return false;
	w->w_raw(&m_buffer[0], m_buffer.size());
	fs.w_close(w);
	return true;
}